

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_VarCounter>::
Read(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_VarCounter> *this)

{
  VarBoundHandler<VarCounter> *in_RDI;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<VarCounter>_>
  reader;
  BinaryReader<mp::internal::IdentityConverter> bound_reader;
  VarBoundHandler<VarCounter> bound_handler;
  VarCounter *in_stack_ffffffffffffff68;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<VarCounter>_>
  local_88;
  BinaryReader<mp::internal::IdentityConverter> local_58;
  VarBoundHandler<VarCounter> local_18;
  
  if (((ulong)in_RDI[1].handler_ & 1) == 0) {
    Read((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_VarCounter> *)
         bound_reader.super_BinaryReaderBase.super_ReaderBase.name_.field_2._M_allocated_capacity,
         (BinaryReader<mp::internal::IdentityConverter> *)
         bound_reader.super_BinaryReaderBase.super_ReaderBase.name_._M_string_length);
  }
  else {
    VarBoundHandler<VarCounter>::VarBoundHandler(in_RDI,in_stack_ffffffffffffff68);
    BinaryReader<mp::internal::IdentityConverter>::BinaryReader
              ((BinaryReader<mp::internal::IdentityConverter> *)in_RDI,
               (BinaryReader<mp::internal::IdentityConverter> *)in_stack_ffffffffffffff68);
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<VarCounter>_>
    ::NLReader(&local_88,&local_58,(NLHeader *)in_RDI->handler_,&local_18,
               *(int *)&in_RDI[1].handler_);
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<VarCounter>_>
    ::Read((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<VarCounter>_>
            *)bound_reader.super_BinaryReaderBase.super_ReaderBase.name_.field_2.
              _M_allocated_capacity,
           (BinaryReader<mp::internal::IdentityConverter> *)
           bound_reader.super_BinaryReaderBase.super_ReaderBase.name_._M_string_length);
    Read((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_VarCounter> *)
         bound_reader.super_BinaryReaderBase.super_ReaderBase.name_.field_2._M_allocated_capacity,
         (BinaryReader<mp::internal::IdentityConverter> *)
         bound_reader.super_BinaryReaderBase.super_ReaderBase.name_._M_string_length);
    BinaryReader<mp::internal::IdentityConverter>::~BinaryReader
              ((BinaryReader<mp::internal::IdentityConverter> *)0x263b76);
    VarBoundHandler<VarCounter>::~VarBoundHandler((VarBoundHandler<VarCounter> *)0x263b83);
  }
  NLHandler<mp::NullNLHandler<int>,_int>::EndInput
            ((NLHandler<mp::NullNLHandler<int>,_int> *)
             in_RDI[1].super_NullNLHandler<int>.super_NLHandler<mp::NullNLHandler<int>,_int>.
             _vptr_NLHandler);
  return;
}

Assistant:

void NLReader<Reader, Handler>::Read() {
  if ((flags_ & READ_BOUNDS_FIRST) != 0) {
    // Read variable bounds first because this allows more efficient
    // problem construction.
    VarBoundHandler<Handler> bound_handler(handler_);
    Reader bound_reader(reader_);
    NLReader< Reader, VarBoundHandler<Handler> >
        reader(bound_reader, header_, bound_handler, flags_);
    reader.Read(0);
    // Read everything else.
    Read(&bound_reader);
  } else {
    Read(0);
  }
  handler_.EndInput();
}